

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

MeshGL * CubeUV(void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<float> __l_02;
  MeshGLP<float,_unsigned_int> *in_RDI;
  value_type_conflict1 local_24c;
  uint local_248 [8];
  iterator local_228;
  undefined8 local_220;
  uint local_218 [6];
  iterator local_200;
  undefined8 local_1f8;
  uint local_1f0 [36];
  iterator local_160;
  undefined8 local_158;
  float local_140 [70];
  iterator local_28;
  undefined8 local_20;
  undefined1 local_11;
  MeshGL *mgl;
  
  local_11 = 0;
  manifold::MeshGLP<float,_unsigned_int>::MeshGLP(in_RDI);
  in_RDI->numProp = 5;
  memcpy(local_140,&DAT_0022d220,0x118);
  local_20 = 0x46;
  __l_02._M_len = 0x46;
  __l_02._M_array = local_140;
  local_28 = local_140;
  std::vector<float,_std::allocator<float>_>::operator=(&in_RDI->vertProperties,__l_02);
  memcpy(local_1f0,&DAT_0022d338,0x90);
  local_158 = 0x24;
  __l_01._M_len = 0x24;
  __l_01._M_array = local_1f0;
  local_160 = local_1f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&in_RDI->triVerts,__l_01);
  local_218[0] = 8;
  local_218[1] = 0xc;
  local_218[2] = 0xd;
  local_218[3] = 9;
  local_218[4] = 10;
  local_218[5] = 0xb;
  local_200 = local_218;
  local_1f8 = 6;
  __l_00._M_len = 6;
  __l_00._M_array = local_200;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&in_RDI->mergeFromVert,__l_00)
  ;
  local_248[0] = 4;
  local_248[1] = 4;
  local_248[2] = 5;
  local_248[3] = 6;
  local_248[4] = 6;
  local_248[5] = 7;
  local_228 = local_248;
  local_220 = 6;
  __l._M_len = 6;
  __l._M_array = local_228;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&in_RDI->mergeToVert,__l);
  local_24c = manifold::Manifold::ReserveIDs(1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&in_RDI->runOriginalID,&local_24c);
  return in_RDI;
}

Assistant:

MeshGL CubeUV() {
  MeshGL mgl;
  mgl.numProp = 5;
  mgl.vertProperties = {0.5,  -0.5, 0.5,  0.5,  0.66,  //
                        -0.5, -0.5, 0.5,  0.25, 0.66,  //
                        0.5,  0.5,  0.5,  0.5,  0.33,  //
                        -0.5, 0.5,  0.5,  0.25, 0.33,  //
                        -0.5, -0.5, -0.5, 1.0,  0.66,  //
                        0.5,  -0.5, -0.5, 0.75, 0.66,  //
                        -0.5, 0.5,  -0.5, 1.0,  0.33,  //
                        0.5,  0.5,  -0.5, 0.75, 0.33,  //
                        -0.5, -0.5, -0.5, 0.0,  0.66,  //
                        -0.5, 0.5,  -0.5, 0.0,  0.33,  //
                        -0.5, 0.5,  -0.5, 0.25, 0.0,   //
                        0.5,  0.5,  -0.5, 0.5,  0.0,   //
                        -0.5, -0.5, -0.5, 0.25, 1.0,   //
                        0.5,  -0.5, -0.5, 0.5,  1.0};
  mgl.triVerts = {3, 1, 0, 3, 0, 2, 7,  5,  4, 7,  4, 6, 2, 0, 5,  2, 5,  7,
                  9, 8, 1, 9, 1, 3, 11, 10, 3, 11, 3, 2, 0, 1, 12, 0, 12, 13};
  mgl.mergeFromVert = {8, 12, 13, 9, 10, 11};
  mgl.mergeToVert = {4, 4, 5, 6, 6, 7};
  mgl.runOriginalID.push_back(Manifold::ReserveIDs(1));
  return mgl;
}